

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O3

int picnic_verify(picnic_publickey_t *pk,uint8_t *message,size_t message_len,uint8_t *signature,
                 size_t signature_len)

{
  byte bVar1;
  int iVar2;
  picnic_instance_t *pp;
  picnic_context_t context;
  picnic_context_t local_e0;
  
  iVar2 = -1;
  if (signature_len != 0 && (signature != (uint8_t *)0x0 && pk != (picnic_publickey_t *)0x0)) {
    bVar1 = pk->data[0];
    pp = picnic_instance_get((uint)bVar1);
    if (pp != (picnic_instance_t *)0x0) {
      local_e0.plaintext = pk->data + (ulong)pp->input_output_size + 1;
      local_e0.public_key = pk->data + 1;
      if ((byte)(bVar1 - 7) < 3) {
        iVar2 = impl_verify_picnic3(pp,local_e0.plaintext,local_e0.public_key,message,message_len,
                                    signature,signature_len);
      }
      else {
        mzd_from_char_array(local_e0.m_plaintext,local_e0.plaintext,(ulong)pp->input_output_size);
        mzd_from_char_array(local_e0.m_key,local_e0.public_key,(ulong)pp->input_output_size);
        local_e0.private_key = (uint8_t *)0x0;
        local_e0.unruh = SUB81(0x1000100010000 >> (((ulong)bVar1 & 7) << 3),0);
        if (6 < bVar1) {
          local_e0.unruh = false;
        }
        local_e0.msg = message;
        local_e0.msglen = message_len;
        iVar2 = picnic_impl_verify(pp,&local_e0,signature,signature_len);
      }
    }
  }
  return iVar2;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_verify(const picnic_publickey_t* pk, const uint8_t* message,
                                            size_t message_len, const uint8_t* signature,
                                            size_t signature_len) {
  if (!pk || !signature || !signature_len) {
    return -1;
  }

  const picnic_params_t param       = pk->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const uint8_t* pk_c  = PK_C(pk);
  const uint8_t* pk_pt = PK_PT(pk, instance);

  if (param == Picnic3_L1 || param == Picnic3_L3 || param == Picnic3_L5) {
#if defined(WITH_KKW)
    return impl_verify_picnic3(instance, pk_pt, pk_c, message, message_len, signature,
                               signature_len);
#else
    return -1;
#endif
  } else {
#if defined(WITH_ZKBPP)
    picnic_context_t context;
    mzd_from_char_array(context.m_plaintext, pk_pt, instance->input_output_size);
    mzd_from_char_array(context.m_key, pk_c, instance->input_output_size);
    context.plaintext   = pk_pt;
    context.private_key = NULL;
    context.public_key  = pk_c;
    context.msg         = message;
    context.msglen      = message_len;
#if defined(WITH_UNRUH)
    context.unruh = picnic_instance_is_unruh(param);
#endif
    return picnic_impl_verify(instance, &context, signature, signature_len);
#else
    return -1;
#endif
  }
}